

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall
QtMWidgets::DateTimePickerPrivate::findMovableSection(DateTimePickerPrivate *this,QPointF *pos)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  
  lVar1 = (this->super_DateTimeParser).sections.d.size;
  iVar2 = -1;
  if (0 < lVar1) {
    piVar3 = &((this->super_DateTimeParser).sections.d.ptr)->sectionWidth;
    lVar4 = 0;
    iVar5 = 0;
    do {
      if ((iVar5 <= (int)pos->xp) && ((int)pos->xp < *piVar3 + iVar5)) {
        iVar2 = (int)lVar4;
        break;
      }
      iVar5 = iVar5 + *piVar3;
      lVar4 = lVar4 + 1;
      piVar3 = piVar3 + 0xc;
    } while (lVar1 != lVar4);
  }
  this->movableSection = iVar2;
  return;
}

Assistant:

void
DateTimePickerPrivate::findMovableSection( const QPointF & pos )
{
	const int x = pos.x();

	int width = 0;

	for( int i = 0; i < sections.size(); ++i )
	{
		if( x >= width && x < width + sections.at( i ).sectionWidth )
		{
			movableSection = i;
			return;
		}

		width += sections.at( i ).sectionWidth;
	}

	movableSection = -1;
}